

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

void __thiscall
btMatrixX<float>::multiplyAdd2_p8r
          (btMatrixX<float> *this,btScalar *B,btScalar *C,int numRows,int numRowsOther,int row,
          int col)

{
  int in_ECX;
  btMatrixX<float> *in_RDX;
  float *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  btScalar sum;
  int j;
  btScalar *cc;
  int i;
  btScalar *bb;
  int row_00;
  btMatrixX<float> *this_00;
  int local_34;
  float *local_30;
  
  local_30 = in_RSI;
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    this_00 = in_RDX;
    for (row_00 = 0; row_00 < in_R8D; row_00 = row_00 + 1) {
      addElem(this_00,row_00,
              (int)(local_30[6] * *(float *)&this_00->m_storage +
                   local_30[5] * *(float *)&this_00->field_0x14 +
                   local_30[4] * (float)this_00->m_setElemOperations +
                   local_30[2] * (float)this_00->m_operations +
                   local_30[1] * (float)this_00->m_cols + *local_30 * (float)this_00->m_rows),
              (float)((ulong)in_RDI >> 0x20));
      this_00 = (btMatrixX<float> *)&(this_00->m_storage).m_capacity;
    }
    local_30 = local_30 + 8;
  }
  return;
}

Assistant:

void multiplyAdd2_p8r (const btScalar *B, const btScalar *C,  int numRows,  int numRowsOther ,int row, int col)
	{
		const btScalar *bb = B;
		for ( int i = 0;i<numRows;i++)
		{
			const btScalar *cc = C;
			for ( int j = 0;j<numRowsOther;j++)
			{
				btScalar sum;
				sum  = bb[0]*cc[0];
				sum += bb[1]*cc[1];
				sum += bb[2]*cc[2];
				sum += bb[4]*cc[4];
				sum += bb[5]*cc[5];
				sum += bb[6]*cc[6];
				addElem(row+i,col+j,sum);
				cc += 8;
			}
			bb += 8;
		}
	}